

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_lex.c
# Opt level: O2

size_t yajl_string_scan(uchar *buf,size_t len,int utf8check)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar2 = 0;
  while ((sVar1 = len, len != sVar2 &&
         (sVar1 = sVar2,
         (byte)(((utf8check != 0) << 4 | 10U) &
               "\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02"
               [buf[sVar2]]) == 0))) {
    sVar2 = sVar2 + 1;
  }
  return sVar1;
}

Assistant:

static size_t
yajl_string_scan(const unsigned char * buf, size_t len, int utf8check)
{
    unsigned char mask = IJC|NFP|(utf8check ? NUC : 0);
    size_t skip = 0;
    while (skip < len && !(charLookupTable[*buf] & mask))
    {
        skip++;
        buf++;
    }
    return skip;
}